

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

int64_t cab_minimum_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  wchar_t wVar1;
  long in_RSI;
  long in_RDI;
  wchar_t err;
  int64_t rbytes;
  int64_t cbytes;
  cfdata *cfdata;
  cab *cab;
  int64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_38;
  long local_30;
  archive_read *a_00;
  archive_read *a_01;
  
  a_01 = (archive_read *)**(undefined8 **)(in_RDI + 0x948);
  a_00 = (archive_read *)(a_01->archive).error;
  if (*(short *)((a_01->archive).compression_name + 6) == 0) {
    local_30 = in_RSI;
    if (*(long *)&(a_00->archive).archive_format <= in_RSI) {
      local_30 = *(long *)&(a_00->archive).archive_format;
    }
    local_38 = in_RSI - local_30;
    *(short *)((long)&(a_00->archive).vtable + 6) =
         *(short *)((long)&(a_00->archive).vtable + 6) + (short)local_30;
    *(short *)((long)&(a_00->archive).vtable + 2) =
         *(short *)((long)&(a_00->archive).vtable + 2) - (short)local_30;
    *(long *)&(a_00->archive).archive_format = *(long *)&(a_00->archive).archive_format - local_30;
  }
  else {
    local_30 = (long)(int)((uint)*(ushort *)((long)&(a_00->archive).vtable + 4) -
                          (uint)*(ushort *)((long)&(a_00->archive).vtable + 6));
    local_38 = in_RSI;
    if (0 < local_30) {
      if (in_RSI < local_30) {
        local_30 = in_RSI;
      }
      local_38 = in_RSI - local_30;
      *(short *)((long)&(a_00->archive).vtable + 6) =
           *(short *)((long)&(a_00->archive).vtable + 6) + (short)local_30;
      *(short *)((long)&(a_00->archive).vtable + 2) =
           *(short *)((long)&(a_00->archive).vtable + 2) - (short)local_30;
    }
    if (*(long *)&(a_00->archive).archive_format == 0) {
      local_30 = 0;
    }
    else {
      local_30 = *(long *)&(a_00->archive).archive_format;
      *(undefined8 *)&(a_00->archive).archive_format = 0;
    }
  }
  if (local_30 != 0) {
    cab_checksum_update(a_01,(size_t)a_00);
    __archive_read_consume
              ((archive_read *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    (a_01->archive).error_string.s = (a_01->archive).error_string.s + local_30;
    *(short *)((long)&(a_00->archive).state + 2) =
         *(short *)((long)&(a_00->archive).state + 2) - (short)local_30;
    if ((*(short *)((long)&(a_00->archive).state + 2) == 0) &&
       (wVar1 = cab_checksum_finish(a_00), wVar1 < L'\0')) {
      return (long)wVar1;
    }
  }
  return local_38;
}

Assistant:

static int64_t
cab_minimum_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	cfdata = cab->entry_cfdata;
	rbytes = consumed_bytes;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		if (consumed_bytes < cfdata->unconsumed)
			cbytes = consumed_bytes;
		else
			cbytes = cfdata->unconsumed;
		rbytes -= cbytes; 
		cfdata->read_offset += (uint16_t)cbytes;
		cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		cfdata->unconsumed -= cbytes;
	} else {
		cbytes = cfdata->uncompressed_avail - cfdata->read_offset;
		if (cbytes > 0) {
			if (consumed_bytes < cbytes)
				cbytes = consumed_bytes;
			rbytes -= cbytes;
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		}

		if (cfdata->unconsumed) {
			cbytes = cfdata->unconsumed;
			cfdata->unconsumed = 0;
		} else
			cbytes = 0;
	}
	if (cbytes) {
		/* Compute the sum. */
		cab_checksum_update(a, (size_t)cbytes);

		/* Consume as much as the compressor actually used. */
		__archive_read_consume(a, cbytes);
		cab->cab_offset += cbytes;
		cfdata->compressed_bytes_remaining -= (uint16_t)cbytes;
		if (cfdata->compressed_bytes_remaining == 0) {
			err = cab_checksum_finish(a);
			if (err < 0)
				return (err);
		}
	}
	return (rbytes);
}